

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O3

void __thiscall amrex::Amr::writePlotFileDoit(Amr *this,string *pltfile,bool regular)

{
  ostringstream *this_00;
  int iVar1;
  pointer pcVar2;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var3;
  undefined4 uVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  ostringstream *this_01;
  string pltfileTemp;
  string HeaderFileName;
  IO_Buffer io_buffer;
  StreamRetry sretry;
  ofstream HeaderFile;
  string local_498;
  string local_478;
  double local_458;
  vector<char,_std::allocator<char>_> local_450;
  double local_438;
  undefined8 local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_428;
  undefined1 local_420 [24];
  undefined8 auStack_408 [46];
  StreamRetry local_298;
  undefined1 local_230 [8];
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  int aiStack_210 [54];
  ios_base local_138 [264];
  
  local_438 = second();
  VisMF::SetNOutFiles((anonymous_namespace)::plot_nfiles,ParallelDescriptor::m_comm);
  uVar4 = VisMF::currentVersion;
  VisMF::currentVersion = (anonymous_namespace)::plot_headerversion;
  StreamRetry::StreamRetry
            (&local_298,pltfile,this->abort_on_stream_retry_failure,this->stream_max_tries);
  bVar5 = AsyncOut::UseAsyncOut();
  if (bVar5) {
    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
    pcVar2 = (pltfile->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_498,pcVar2,pcVar2 + pltfile->_M_string_length);
  }
  else {
    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
    pcVar2 = (pltfile->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_498,pcVar2,pcVar2 + pltfile->_M_string_length);
    std::__cxx11::string::append((char *)&local_498);
  }
  local_428 = _VTT;
  local_430 = __M_insert<void_const*>;
  do {
    bVar5 = StreamRetry::TryFileOutput(&local_298);
    if (!bVar5) break;
    if ((anonymous_namespace)::precreateDirectories == '\x01') {
      UtilRenameDirectoryToOld(pltfile,false);
      UtilCreateCleanDirectory(&local_498,false);
      if (-1 < *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c) {
        lVar6 = -1;
        do {
          _Var3.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
          super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
               (this->amr_level).
               super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar6 + 1]._M_t.
               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
          (**(code **)(*(long *)_Var3.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x10
                      ))(_Var3.
                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                         .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,&local_498);
          lVar6 = lVar6 + 1;
        } while (lVar6 < *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
      }
      local_230 = (undefined1  [8])&local_220;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Amr::writePlotFile:PCD","");
      ParallelDescriptor::Barrier((string *)local_230);
      if (local_230 != (undefined1  [8])&local_220) {
        operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
      }
    }
    else {
      UtilRenameDirectoryToOld(pltfile,false);
      UtilCreateCleanDirectory(&local_498,true);
    }
    local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_478,local_498._M_dataplus._M_p,
               local_498._M_dataplus._M_p + local_498._M_string_length);
    std::__cxx11::string::append((char *)&local_478);
    std::vector<char,_std::allocator<char>_>::vector
              (&local_450,VisMFBuffer::ioBufferSize,(allocator_type *)local_230);
    std::ofstream::ofstream((string *)local_230);
    (**(code **)(local_228 + 0x18))
              (&local_228,
               local_450.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)local_450.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_450.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
    if (*(int *)(ParallelContext::frames + 0xc) == 0) {
      std::ofstream::open((char *)local_230,(_Ios_Openmode)local_478._M_dataplus._M_p);
      lVar7 = *(long *)((long)local_230 + -0x18);
      if (*(int *)((long)aiStack_210 + lVar7) != 0) {
        FileOpenFailed(&local_478);
        lVar7 = *(long *)((long)local_230 + -0x18);
      }
      lVar6 = (long)*(int *)((long)&local_228 + lVar7);
      *(undefined8 *)((long)&local_228 + lVar7) = 0xf;
    }
    else {
      lVar6 = 0;
    }
    iVar1 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
    if (regular) {
      if (-1 < iVar1) {
        lVar7 = -1;
        do {
          _Var3.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
          super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
               (this->amr_level).
               super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar7 + 1]._M_t.
               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
          (**(code **)(*(long *)_Var3.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x28
                      ))(_Var3.
                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                         .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,&local_498,
                         (string *)local_230);
          iVar1 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
          lVar7 = lVar7 + 1;
        } while (lVar7 < iVar1);
        if (-1 < iVar1) {
          lVar7 = -1;
          do {
            _Var3.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t
            .super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
            super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
                 (this->amr_level).
                 super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar7 + 1]._M_t.
                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
            (**(code **)(*(long *)_Var3.
                                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                  .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                        0x20))(_Var3.
                               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                               .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                               &local_498,(string *)local_230,1);
            iVar1 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
            lVar7 = lVar7 + 1;
          } while (lVar7 < iVar1);
          if (-1 < iVar1) {
            lVar7 = -1;
            do {
              _Var3.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
              _M_t.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
              super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
                   (this->amr_level).
                   super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar7 + 1]._M_t.
                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
              (**(code **)(*(long *)_Var3.
                                    super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                    .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                          0x30))(_Var3.
                                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                 .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                                 &local_498,(string *)local_230);
              lVar7 = lVar7 + 1;
            } while (lVar7 < *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
          }
        }
      }
    }
    else if (-1 < iVar1) {
      lVar7 = -1;
      do {
        _Var3.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
        super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
             (this->amr_level).
             super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar7 + 1]._M_t.
             super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
        (**(code **)(*(long *)_Var3.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x38))
                  (_Var3.
                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                   super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,&local_498,
                   (string *)local_230,1);
        lVar7 = lVar7 + 1;
      } while (lVar7 < *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
    }
    if ((*(int *)(ParallelContext::frames + 0xc) == 0) &&
       (*(long *)((long)&local_228 + *(long *)((long)local_230 + -0x18)) = lVar6,
       *(int *)((long)aiStack_210 + *(long *)((long)local_230 + -0x18)) != 0)) {
      if (!regular) {
        Error_host("Amr::writeSmallPlotFile() failed");
        goto LAB_005ac742;
      }
      Error_host("Amr::writePlotFile() failed");
LAB_005ac724:
      this->last_plotfile =
           *(this->level_steps).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      if (regular) goto LAB_005ac724;
LAB_005ac742:
      this->last_smallplotfile =
           *(this->level_steps).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    }
    this_01 = (ostringstream *)(local_420 + 0x10);
    if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
      local_458 = second();
      local_458 = local_458 - local_438;
      if (regular) {
        local_420._8_8_ = OutStream();
        local_420._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
        local_420._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
        std::__cxx11::ostringstream::ostringstream(this_01);
        *(undefined8 *)((long)auStack_408 + *(long *)(local_420._16_8_ - 0x18)) =
             *(undefined8 *)(local_420._8_8_ + *(long *)(*(long *)local_420._8_8_ + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_01,"Write plotfile time = ",0x16);
        std::ostream::_M_insert<double>(local_458);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"  seconds",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\n\n",2);
      }
      else {
        local_420._8_8_ = OutStream();
        this_00 = (ostringstream *)(local_420 + 0x10);
        local_420._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
        local_420._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
        std::__cxx11::ostringstream::ostringstream(this_00);
        *(undefined8 *)((long)auStack_408 + *(long *)(local_420._16_8_ - 0x18)) =
             *(undefined8 *)(local_420._8_8_ + *(long *)(*(long *)local_420._8_8_ + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Write small plotfile time = ",0x1c);
        std::ostream::_M_insert<double>(local_458);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"  seconds",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n\n",2);
      }
      Print::~Print((Print *)local_420);
    }
    bVar5 = AsyncOut::UseAsyncOut();
    if (!bVar5) {
      local_420._0_8_ = this_01;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_420,"Amr::writePlotFile::end","");
      ParallelDescriptor::Barrier((string *)local_420);
      if ((ostringstream *)local_420._0_8_ != this_01) {
        operator_delete((void *)local_420._0_8_,local_420._16_8_ + 1);
      }
      if (*(int *)(ParallelContext::frames + 0xc) == 0) {
        std::ofstream::close();
        rename(local_498._M_dataplus._M_p,(pltfile->_M_dataplus)._M_p);
      }
      local_420._0_8_ = this_01;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_420,"Renaming temporary plotfile.","");
      ParallelDescriptor::Barrier((string *)local_420);
      if ((ostringstream *)local_420._0_8_ != this_01) {
        operator_delete((void *)local_420._0_8_,local_420._16_8_ + 1);
      }
    }
    local_230 = (undefined1  [8])local_428;
    *(undefined8 *)(local_230 + *(long *)(local_428->_M_local_buf + -0x18)) = local_430;
    std::filebuf::~filebuf((filebuf *)&local_228);
    std::ios_base::~ios_base(local_138);
    if (local_450.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_450.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_450.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_450.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
    }
  } while (!bVar5);
  VisMF::currentVersion = uVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298.suffix._M_dataplus._M_p != &local_298.suffix.field_2) {
    operator_delete(local_298.suffix._M_dataplus._M_p,
                    local_298.suffix.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298.fileName._M_dataplus._M_p != &local_298.fileName.field_2) {
    operator_delete(local_298.fileName._M_dataplus._M_p,
                    local_298.fileName.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
Amr::writePlotFileDoit (std::string const& pltfile, bool regular)
{
    auto dPlotFileTime0 = amrex::second();

    VisMF::SetNOutFiles(plot_nfiles);
    VisMF::Header::Version currentVersion(VisMF::GetHeaderVersion());
    VisMF::SetHeaderVersion(plot_headerversion);

    amrex::StreamRetry sretry(pltfile, abort_on_stream_retry_failure,
                              stream_max_tries);

    const std::string pltfileTemp = (AsyncOut::UseAsyncOut()) ? pltfile : (pltfile + ".temp");

    while(sretry.TryFileOutput()) {
        //
        //  if either the pltfile or pltfileTemp exists, rename them
        //  to move them out of the way.  then create pltfile
        //  with the temporary name, then rename it back when
        //  it is finished writing.  then stream retry can rename
        //  it to a bad suffix if there were stream errors.
        //

        if (precreateDirectories) {    // ---- make all directories at once
            amrex::UtilRenameDirectoryToOld(pltfile, false);      // dont call barrier
            amrex::UtilCreateCleanDirectory(pltfileTemp, false);  // dont call barrier
            for(int i(0); i <= finest_level; ++i) {
                amr_level[i]->CreateLevelDirectory(pltfileTemp);
            }
            ParallelDescriptor::Barrier("Amr::writePlotFile:PCD");
        } else {
            amrex::UtilRenameDirectoryToOld(pltfile, false);     // dont call barrier
            amrex::UtilCreateCleanDirectory(pltfileTemp, true);  // call barrier
        }

        std::string HeaderFileName(pltfileTemp + "/Header");

        VisMF::IO_Buffer io_buffer(VisMF::GetIOBufferSize());

        std::ofstream HeaderFile;

        HeaderFile.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());

        int old_prec(0);

        if (ParallelDescriptor::IOProcessor()) {
            //
            // Only the IOProcessor() writes to the header file.
            //
            HeaderFile.open(HeaderFileName.c_str(), std::ios::out | std::ios::trunc |
                            std::ios::binary);
            if ( ! HeaderFile.good()) {
                amrex::FileOpenFailed(HeaderFileName);
            }
            old_prec = HeaderFile.precision(15);
        }

        if (regular) {
            for (int k(0); k <= finest_level; ++k) {
                amr_level[k]->writePlotFilePre(pltfileTemp, HeaderFile);
            }
            for (int k(0); k <= finest_level; ++k) {
                amr_level[k]->writePlotFile(pltfileTemp, HeaderFile);
            }
            for (int k(0); k <= finest_level; ++k) {
                amr_level[k]->writePlotFilePost(pltfileTemp, HeaderFile);
            }
        } else {
            for (int k(0); k <= finest_level; ++k) {
                amr_level[k]->writeSmallPlotFile(pltfileTemp, HeaderFile);
            }
        }

        if (ParallelDescriptor::IOProcessor()) {
            HeaderFile.precision(old_prec);
            if ( ! HeaderFile.good()) {
                if (regular) {
                    amrex::Error("Amr::writePlotFile() failed");
                } else {
                    amrex::Error("Amr::writeSmallPlotFile() failed");
                }
            }
        }

        if (regular) {
            last_plotfile = level_steps[0];
        } else {
            last_smallplotfile = level_steps[0];
        }

        if (verbose > 0) {
            const int IOProc        = ParallelDescriptor::IOProcessorNumber();
            auto      dPlotFileTime = amrex::second() - dPlotFileTime0;
            ParallelDescriptor::ReduceRealMax(dPlotFileTime,IOProc);
            if (regular) {
                amrex::Print() << "Write plotfile time = " << dPlotFileTime << "  seconds" << "\n\n";
            } else {
                amrex::Print() << "Write small plotfile time = " << dPlotFileTime << "  seconds" << "\n\n";
            }
        }

        if (AsyncOut::UseAsyncOut()) {
            break;
        } else {
            ParallelDescriptor::Barrier("Amr::writePlotFile::end");
            if(ParallelDescriptor::IOProcessor()) {
                HeaderFile.close();
                std::rename(pltfileTemp.c_str(), pltfile.c_str());
            }
            ParallelDescriptor::Barrier("Renaming temporary plotfile.");
            //
            // the plotfile file now has the regular name
            //
        }
    }  // end while

    VisMF::SetHeaderVersion(currentVersion);
}